

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall anon_unknown.dwarf_757116::BacktraceGuard::~BacktraceGuard(BacktraceGuard *this)

{
  BacktraceGuard *this_local;
  
  cmListFileBacktrace::operator=(this->Backtrace,&this->Previous);
  cmListFileBacktrace::~cmListFileBacktrace(&this->Previous);
  return;
}

Assistant:

~BacktraceGuard() { this->Backtrace = std::move(this->Previous); }